

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  int iVar15;
  uint uVar16;
  int *piVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_20c;
  cpp_dec_float<50U,_int,_void> local_208;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> local_188;
  int *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  int *local_138;
  int *local_130;
  pointer local_128;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_120;
  int *local_118;
  int *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  int *local_100;
  ulong local_f8;
  int *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_188.fpclass = cpp_dec_float_finite;
  local_188.prec_elem = 10;
  local_188.data._M_elems[0] = 0;
  local_188.data._M_elems[1] = 0;
  local_188.data._M_elems[2] = 0;
  local_188.data._M_elems[3] = 0;
  local_188.data._M_elems[4] = 0;
  local_188.data._M_elems[5] = 0;
  local_188.data._M_elems._24_5_ = 0;
  local_188.data._M_elems[7]._1_3_ = 0;
  local_188.data._M_elems[8] = 0;
  local_188.data._M_elems[9] = 0;
  local_188.exp = 0;
  local_188.neg = false;
  local_110 = (this->row).orig;
  piVar17 = (this->col).orig;
  local_f0 = (this->col).perm;
  if (0 < rhsn) {
    uVar9 = 0;
    do {
      iVar7 = local_f0[rhsidx[uVar9]];
      if (uVar9 == 0) {
        uVar13 = 0;
      }
      else {
        uVar10 = uVar9 & 0xffffffff;
        do {
          uVar16 = (uint)uVar10 - 1;
          uVar12 = uVar16 >> 1;
          uVar13 = (uint)uVar10;
          if (rhsidx[uVar12] <= iVar7) break;
          rhsidx[uVar10] = rhsidx[uVar12];
          uVar10 = (ulong)uVar12;
          uVar13 = uVar12;
        } while (1 < uVar16);
      }
      uVar9 = uVar9 + 1;
      rhsidx[(int)uVar13] = iVar7;
    } while (uVar9 != (uint)rhsn);
  }
  if (rhsn < 1) {
    iVar7 = 0;
  }
  else {
    local_128 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_130 = (this->u).row.idx;
    local_118 = (this->u).row.len;
    local_138 = (this->u).row.start;
    uVar9 = 0;
    local_150 = piVar17;
    local_148 = eps;
    local_140 = rhs;
    local_120 = this;
    local_108 = vec;
    local_100 = vecidx;
    do {
      iVar7 = *rhsidx;
      local_20c = rhsn - 1;
      iVar5 = rhsidx[(long)rhsn + -1];
      iVar8 = 1;
      iVar6 = 0;
      if (3 < rhsn) {
        iVar6 = 0;
        do {
          iVar3 = rhsidx[iVar8];
          iVar15 = rhsidx[(long)iVar8 + 1];
          piVar14 = rhsidx + iVar6;
          if (iVar3 < iVar15) {
            iVar6 = iVar8;
            iVar15 = iVar3;
            if (iVar5 <= iVar3) goto LAB_00291b76;
          }
          else {
            if (iVar5 <= iVar15) goto LAB_00291b76;
            iVar6 = iVar8 + 1;
          }
          *piVar14 = iVar15;
          iVar8 = iVar6 * 2 + 1;
        } while (iVar8 < (int)(rhsn - 2U));
      }
      if ((iVar8 < (int)local_20c) && (rhsidx[iVar8] < iVar5)) {
        rhsidx[iVar6] = rhsidx[iVar8];
        iVar6 = iVar8;
      }
      piVar14 = rhsidx + iVar6;
LAB_00291b76:
      *piVar14 = iVar5;
      iVar5 = piVar17[iVar7];
      local_1c8.data._M_elems._32_8_ = *(undefined8 *)(local_140[iVar5].m_backend.data._M_elems + 8)
      ;
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)local_140[iVar5].m_backend.data._M_elems;
      local_1c8.data._M_elems._8_8_ = *(undefined8 *)(local_140[iVar5].m_backend.data._M_elems + 2);
      puVar2 = local_140[iVar5].m_backend.data._M_elems + 4;
      local_1c8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_1c8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1c8.exp = local_140[iVar5].m_backend.exp;
      local_1c8.neg = local_140[iVar5].m_backend.neg;
      local_1c8.fpclass = local_140[iVar5].m_backend.fpclass;
      local_1c8.prec_elem = local_140[iVar5].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&local_140[iVar5].m_backend,0);
      local_208.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
      local_208.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
      local_208.data._M_elems[4] = local_1c8.data._M_elems[4];
      local_208.data._M_elems[5] = local_1c8.data._M_elems[5];
      local_208.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
      local_208.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
      local_208.data._M_elems[0] = local_1c8.data._M_elems[0];
      local_208.data._M_elems[1] = local_1c8.data._M_elems[1];
      uVar4 = local_208.data._M_elems._0_8_;
      local_208.data._M_elems[2] = local_1c8.data._M_elems[2];
      local_208.data._M_elems[3] = local_1c8.data._M_elems[3];
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_148->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_148->m_backend).data._M_elems + 8);
      local_68.exp = (local_148->m_backend).exp;
      local_68.neg = (local_148->m_backend).neg;
      local_68.fpclass = (local_148->m_backend).fpclass;
      local_68.prec_elem = (local_148->m_backend).prec_elem;
      local_208.exp = local_1c8.exp;
      local_208.neg = local_1c8.neg;
      local_208.fpclass = local_1c8.fpclass;
      local_208.prec_elem = local_1c8.prec_elem;
      if ((local_1c8.neg == true) &&
         (local_208.data._M_elems[0] = local_1c8.data._M_elems[0],
         local_208.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite)) {
        local_208.neg = false;
      }
      local_208.data._M_elems._0_8_ = uVar4;
      if ((local_68.fpclass != cpp_dec_float_NaN && local_1c8.fpclass != cpp_dec_float_NaN) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_208,&local_68), 0 < iVar5)) {
        iVar7 = local_110[iVar7];
        uVar10 = (ulong)((int)uVar9 + 1);
        local_100[(int)uVar9] = iVar7;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_1c8,
                   &(this->diag).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
        *(undefined8 *)local_108[iVar7].m_backend.data._M_elems = local_1c8.data._M_elems._0_8_;
        *(undefined8 *)(local_108[iVar7].m_backend.data._M_elems + 2) =
             local_1c8.data._M_elems._8_8_;
        puVar2 = local_108[iVar7].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_1c8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_1c8.data._M_elems[7]._1_3_,local_1c8.data._M_elems._24_5_);
        *(undefined8 *)(local_108[iVar7].m_backend.data._M_elems + 8) =
             local_1c8.data._M_elems._32_8_;
        local_108[iVar7].m_backend.exp = local_1c8.exp;
        local_108[iVar7].m_backend.neg = local_1c8.neg;
        local_108[iVar7].m_backend.fpclass = local_1c8.fpclass;
        local_108[iVar7].m_backend.prec_elem = local_1c8.prec_elem;
        iVar5 = local_118[iVar7];
        uVar9 = uVar10;
        piVar17 = local_150;
        if (iVar5 != 0) {
          pcVar18 = &local_128[local_138[iVar7]].m_backend;
          piVar14 = local_130 + local_138[iVar7];
          local_f8 = uVar10;
          do {
            iVar7 = *piVar14;
            pnVar1 = local_140 + iVar7;
            local_188.data._M_elems._32_8_ =
                 *(undefined8 *)(local_140[iVar7].m_backend.data._M_elems + 8);
            local_188.data._M_elems._0_8_ = *(undefined8 *)local_140[iVar7].m_backend.data._M_elems;
            local_188.data._M_elems._8_8_ =
                 *(undefined8 *)(local_140[iVar7].m_backend.data._M_elems + 2);
            puVar2 = local_140[iVar7].m_backend.data._M_elems + 4;
            local_188.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 2);
            local_188.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_188.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_188.exp = local_140[iVar7].m_backend.exp;
            local_188.neg = local_140[iVar7].m_backend.neg;
            local_188.fpclass = local_140[iVar7].m_backend.fpclass;
            local_188.prec_elem = local_140[iVar7].m_backend.prec_elem;
            if (local_188.fpclass == cpp_dec_float_NaN) {
LAB_00291e10:
              local_208.fpclass = cpp_dec_float_finite;
              local_208.prec_elem = 10;
              local_208.data._M_elems[0] = 0;
              local_208.data._M_elems[1] = 0;
              local_208.data._M_elems[2] = 0;
              local_208.data._M_elems[3] = 0;
              local_208.data._M_elems[4] = 0;
              local_208.data._M_elems[5] = 0;
              local_208.data._M_elems._24_5_ = 0;
              local_208.data._M_elems[7]._1_3_ = 0;
              local_208.data._M_elems._32_5_ = 0;
              local_208.data._M_elems[9]._1_3_ = 0;
              local_208.exp = 0;
              local_208.neg = false;
              pcVar11 = &local_1c8;
              if (&local_208 != pcVar18) {
                local_208.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
                local_208.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
                local_208.data._M_elems[4] = local_1c8.data._M_elems[4];
                local_208.data._M_elems[5] = local_1c8.data._M_elems[5];
                local_208.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
                local_208.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
                local_208.data._M_elems[0] = local_1c8.data._M_elems[0];
                local_208.data._M_elems[1] = local_1c8.data._M_elems[1];
                local_208.data._M_elems[2] = local_1c8.data._M_elems[2];
                local_208.data._M_elems[3] = local_1c8.data._M_elems[3];
                local_208.exp = local_1c8.exp;
                local_208.neg = local_1c8.neg;
                local_208.fpclass = local_1c8.fpclass;
                local_208.prec_elem = local_1c8.prec_elem;
                pcVar11 = pcVar18;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_208,pcVar11);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,&local_208);
              if (local_188.fpclass == cpp_dec_float_NaN) {
LAB_00291ebf:
                local_208.data._M_elems._32_5_ = local_188.data._M_elems._32_5_;
                local_208.data._M_elems[9]._1_3_ = local_188.data._M_elems[9]._1_3_;
                local_208.data._M_elems[4] = local_188.data._M_elems[4];
                local_208.data._M_elems[5] = local_188.data._M_elems[5];
                local_208.data._M_elems._24_5_ = local_188.data._M_elems._24_5_;
                local_208.data._M_elems[7]._1_3_ = local_188.data._M_elems[7]._1_3_;
                local_208.data._M_elems[0] = local_188.data._M_elems[0];
                local_208.data._M_elems[1] = local_188.data._M_elems[1];
                local_208.data._M_elems[2] = local_188.data._M_elems[2];
                local_208.data._M_elems[3] = local_188.data._M_elems[3];
                local_208.exp = local_188.exp;
                local_208.neg = local_188.neg;
                local_208.fpclass = local_188.fpclass;
                local_208.prec_elem = local_188.prec_elem;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_208,0,(type *)0x0);
                iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_188,&local_208);
                if (iVar7 != 0) goto LAB_00291ebf;
                local_208.fpclass = cpp_dec_float_finite;
                local_208.prec_elem = 10;
                local_208.data._M_elems[0] = 0;
                local_208.data._M_elems[1] = 0;
                local_208.data._M_elems[2] = 0;
                local_208.data._M_elems[3] = 0;
                local_208.data._M_elems[4] = 0;
                local_208.data._M_elems[5] = 0;
                local_208.data._M_elems._24_5_ = 0;
                local_208.data._M_elems[7]._1_3_ = 0;
                local_208.data._M_elems._32_5_ = 0;
                local_208.data._M_elems[9]._1_3_ = 0;
                local_208.exp = 0;
                local_208.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_208,1e-100);
              }
              *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                   CONCAT35(local_208.data._M_elems[9]._1_3_,local_208.data._M_elems._32_5_);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_208.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_208.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_208.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_208.exp;
              (pnVar1->m_backend).neg = local_208.neg;
              (pnVar1->m_backend).fpclass = local_208.fpclass;
              (pnVar1->m_backend).prec_elem = local_208.prec_elem;
              uVar4 = local_188.data._M_elems._16_8_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_208,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_188,&local_208);
              if (iVar6 != 0) goto LAB_00291e10;
              local_e8.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
              local_e8.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
              local_e8.data._M_elems[0] = local_1c8.data._M_elems[0];
              local_e8.data._M_elems[1] = local_1c8.data._M_elems[1];
              uVar4 = local_e8.data._M_elems._0_8_;
              local_e8.data._M_elems[2] = local_1c8.data._M_elems[2];
              local_e8.data._M_elems[3] = local_1c8.data._M_elems[3];
              local_e8.data._M_elems[8] = local_1c8.data._M_elems[8];
              local_e8.data._M_elems[9] = local_1c8.data._M_elems[9];
              local_e8.data._M_elems[4] = local_1c8.data._M_elems[4];
              local_e8.data._M_elems[5] = local_1c8.data._M_elems[5];
              local_e8.exp = local_1c8.exp;
              local_e8.neg = local_1c8.neg;
              local_e8.fpclass = local_1c8.fpclass;
              local_e8.prec_elem = local_1c8.prec_elem;
              local_e8.data._M_elems[0] = local_1c8.data._M_elems[0];
              if (local_e8.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite) {
                local_e8.neg = (bool)(local_1c8.neg ^ 1);
              }
              local_208.fpclass = cpp_dec_float_finite;
              local_208.prec_elem = 10;
              local_208.data._M_elems[0] = 0;
              local_208.data._M_elems[1] = 0;
              local_208.data._M_elems[2] = 0;
              local_208.data._M_elems[3] = 0;
              local_208.data._M_elems[4] = 0;
              local_208.data._M_elems[5] = 0;
              local_208.data._M_elems._24_5_ = 0;
              local_208.data._M_elems[7]._1_3_ = 0;
              local_208.data._M_elems._32_5_ = 0;
              local_208.data._M_elems[9]._1_3_ = 0;
              local_208.exp = 0;
              local_208.neg = false;
              pcVar11 = &local_e8;
              if (&local_208 != pcVar18) {
                local_208.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
                local_208.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
                local_208.data._M_elems[4] = local_1c8.data._M_elems[4];
                local_208.data._M_elems[5] = local_1c8.data._M_elems[5];
                local_208.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
                local_208.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
                local_208.data._M_elems[0] = local_1c8.data._M_elems[0];
                local_208.data._M_elems[1] = local_1c8.data._M_elems[1];
                local_208.data._M_elems[2] = local_1c8.data._M_elems[2];
                local_208.data._M_elems[3] = local_1c8.data._M_elems[3];
                local_208.exp = local_1c8.exp;
                local_208.neg = local_e8.neg;
                local_208.fpclass = local_1c8.fpclass;
                local_208.prec_elem = local_1c8.prec_elem;
                pcVar11 = pcVar18;
              }
              local_e8.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_208,pcVar11);
              local_188.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
              local_188.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
              uVar4._0_4_ = local_208.data._M_elems[4];
              uVar4._4_4_ = local_208.data._M_elems[5];
              local_188.data._M_elems[4] = local_208.data._M_elems[4];
              local_188.data._M_elems[5] = local_208.data._M_elems[5];
              local_188.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_188.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_188.data._M_elems[0] = local_208.data._M_elems[0];
              local_188.data._M_elems[1] = local_208.data._M_elems[1];
              local_188.data._M_elems[2] = local_208.data._M_elems[2];
              local_188.data._M_elems[3] = local_208.data._M_elems[3];
              local_188.exp = local_208.exp;
              local_188.neg = local_208.neg;
              local_188.prec_elem = local_208.prec_elem;
              local_188.fpclass = local_208.fpclass;
              local_a8.data._M_elems._32_8_ =
                   *(undefined8 *)((local_148->m_backend).data._M_elems + 8);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_148->m_backend).data._M_elems;
              local_a8.data._M_elems._8_8_ =
                   *(undefined8 *)((local_148->m_backend).data._M_elems + 2);
              local_a8.data._M_elems._16_8_ =
                   *(undefined8 *)((local_148->m_backend).data._M_elems + 4);
              local_a8.data._M_elems._24_8_ =
                   *(undefined8 *)((local_148->m_backend).data._M_elems + 6);
              local_a8.exp = (local_148->m_backend).exp;
              local_a8.neg = (local_148->m_backend).neg;
              local_a8.fpclass = (local_148->m_backend).fpclass;
              local_a8.prec_elem = (local_148->m_backend).prec_elem;
              if ((local_208.neg == true) &&
                 (local_208.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
                local_208.neg = false;
              }
              if ((local_a8.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN)
                 && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_208,&local_a8),
                    uVar4 = local_188.data._M_elems._16_8_, 0 < iVar6)) {
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                     local_188.data._M_elems._32_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                     local_188.data._M_elems._16_8_;
                *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                     CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
                *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_188.data._M_elems._0_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) =
                     local_188.data._M_elems._8_8_;
                (pnVar1->m_backend).exp = local_188.exp;
                (pnVar1->m_backend).neg = local_188.neg;
                (pnVar1->m_backend).fpclass = local_188.fpclass;
                (pnVar1->m_backend).prec_elem = local_188.prec_elem;
                iVar7 = local_f0[iVar7];
                uVar13 = local_20c;
                if (0 < (int)local_20c) {
                  do {
                    uVar12 = uVar13 - 1;
                    uVar16 = uVar12 >> 1;
                    if (rhsidx[uVar16] <= iVar7) break;
                    rhsidx[uVar13] = rhsidx[uVar16];
                    uVar13 = uVar16;
                  } while (1 < uVar12);
                }
                local_20c = local_20c + 1;
                rhsidx[(int)uVar13] = iVar7;
              }
            }
            local_188.data._M_elems._16_8_ = uVar4;
            piVar14 = piVar14 + 1;
            pcVar18 = pcVar18 + 1;
            iVar5 = iVar5 + -1;
            uVar9 = local_f8;
            piVar17 = local_150;
            this = local_120;
          } while (iVar5 != 0);
        }
      }
      iVar7 = (int)uVar9;
      rhsn = local_20c;
    } while (0 < (int)local_20c);
  }
  return iVar7;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}